

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int ref_singleton(saucy *s,coloring *c,int *adj,int *edg,int cf)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  
  lVar2 = (long)c->lab[cf];
  iVar1 = adj[lVar2];
  if (iVar1 != adj[lVar2 + 1]) {
    piVar3 = edg + iVar1;
    do {
      if (c->clen[c->cfront[*piVar3]] != 0) {
        move_to_back(s,c,*piVar3);
      }
      piVar3 = piVar3 + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != adj[lVar2 + 1]);
  }
  iVar1 = refine_cell(s,c,ref_single_cell);
  return iVar1;
}

Assistant:

static int
ref_singleton(struct saucy *s, struct coloring *c,
    const int *adj, const int *edg, int cf)
{
    int i, k = c->lab[cf];

    /* Find the cells we're connected to, and mark our neighbors */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        data_mark(s, c, edg[i]);
    }

    /* Refine the cells we're connected to */
    return refine_cell(s, c, ref_single_cell);
}